

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

char * mpc_err_string(mpc_err_t *x)

{
  byte bVar1;
  char **ppcVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  size_t sVar6;
  char *fmt;
  int *max;
  int *max_00;
  int *extraout_RDX;
  int *extraout_RDX_00;
  int *piVar7;
  int *extraout_RDX_01;
  int *extraout_RDX_02;
  int *max_01;
  long lVar8;
  int pos;
  
  pos = 0;
  pcVar4 = (char *)calloc(1,0x400);
  if (x->failure != (char *)0x0) {
    mpc_err_string_cat(pcVar4,&pos,max,"%s: error: %s\n",x->filename);
    return pcVar4;
  }
  lVar5 = (x->state).col + 1;
  mpc_err_string_cat(pcVar4,&pos,max,"%s:%li:%li: error: expected ",x->filename,(x->state).row + 1,
                     lVar5);
  iVar3 = x->expected_num;
  piVar7 = max_00;
  if (iVar3 == 0) {
    mpc_err_string_cat(pcVar4,&pos,max_00,"ERROR: NOTHING EXPECTED");
    iVar3 = x->expected_num;
    piVar7 = extraout_RDX;
  }
  if (iVar3 == 1) {
    mpc_err_string_cat(pcVar4,&pos,piVar7,"%s",*x->expected);
    iVar3 = x->expected_num;
    piVar7 = extraout_RDX_00;
  }
  if (1 < iVar3) {
    lVar8 = 0;
    while( true ) {
      piVar7 = (int *)(long)(iVar3 + -2);
      ppcVar2 = x->expected;
      if ((long)piVar7 <= lVar8) break;
      mpc_err_string_cat(pcVar4,&pos,piVar7,"%s, ",ppcVar2[lVar8]);
      lVar8 = lVar8 + 1;
      iVar3 = x->expected_num;
    }
    mpc_err_string_cat(pcVar4,&pos,piVar7,"%s or %s",ppcVar2[(long)piVar7],ppcVar2[(long)iVar3 + -1]
                       ,lVar5);
    piVar7 = extraout_RDX_01;
  }
  mpc_err_string_cat(pcVar4,&pos,piVar7," at ");
  bVar1 = x->received;
  builtin_strncpy(char_unescape_buffer,"\' \'",4);
  if ((ulong)bVar1 < 0xe) {
    piVar7 = (int *)((long)&switchD_001019c2::switchdataD_0010a1ac +
                    (long)(int)(&switchD_001019c2::switchdataD_0010a1ac)[bVar1]);
    switch(bVar1) {
    case 0:
      fmt = "end of input";
      break;
    default:
      goto switchD_001019c2_caseD_1;
    case 7:
      fmt = "bell";
      break;
    case 8:
      fmt = "backspace";
      break;
    case 9:
      fmt = "tab";
      break;
    case 10:
      fmt = "newline";
      break;
    case 0xb:
      fmt = "vertical tab";
      break;
    case 0xc:
      fmt = "formfeed";
      break;
    case 0xd:
      fmt = "carriage return";
    }
  }
  else {
    piVar7 = extraout_RDX_02;
    if (bVar1 == 0x20) {
      fmt = "space";
      goto LAB_00101a27;
    }
switchD_001019c2_caseD_1:
    char_unescape_buffer[1] = bVar1;
    char_unescape_buffer[0] = '\'';
    char_unescape_buffer[2] = '\'';
    char_unescape_buffer[3] = '\0';
    fmt = char_unescape_buffer;
  }
LAB_00101a27:
  mpc_err_string_cat(pcVar4,&pos,piVar7,fmt);
  mpc_err_string_cat(pcVar4,&pos,max_01,"\n");
  sVar6 = strlen(pcVar4);
  pcVar4 = (char *)realloc(pcVar4,sVar6 + 1);
  return pcVar4;
}

Assistant:

char *mpc_err_string(mpc_err_t *x) {

  int i;
  int pos = 0;
  int max = 1023;
  char *buffer = calloc(1, 1024);

  if (x->failure) {
    mpc_err_string_cat(buffer, &pos, &max,
    "%s: error: %s\n", x->filename, x->failure);
    return buffer;
  }

  mpc_err_string_cat(buffer, &pos, &max,
    "%s:%li:%li: error: expected ", x->filename, x->state.row+1, x->state.col+1);

  if (x->expected_num == 0) { mpc_err_string_cat(buffer, &pos, &max, "ERROR: NOTHING EXPECTED"); }
  if (x->expected_num == 1) { mpc_err_string_cat(buffer, &pos, &max, "%s", x->expected[0]); }
  if (x->expected_num >= 2) {

    for (i = 0; i < x->expected_num-2; i++) {
      mpc_err_string_cat(buffer, &pos, &max, "%s, ", x->expected[i]);
    }

    mpc_err_string_cat(buffer, &pos, &max, "%s or %s",
      x->expected[x->expected_num-2],
      x->expected[x->expected_num-1]);
  }

  mpc_err_string_cat(buffer, &pos, &max, " at ");
  mpc_err_string_cat(buffer, &pos, &max, mpc_err_char_unescape(x->received));
  mpc_err_string_cat(buffer, &pos, &max, "\n");

  return realloc(buffer, strlen(buffer) + 1);
}